

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O3

int __thiscall chrono::ChSystemDescriptor::CountActiveConstraints(ChSystemDescriptor *this)

{
  pointer ppCVar1;
  pointer ppCVar2;
  ChConstraint *pCVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  if (this->freeze_count == true) {
    return this->n_c;
  }
  ppCVar1 = (this->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar2 = (this->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  this->n_c = 0;
  lVar5 = (long)ppCVar2 - (long)ppCVar1;
  if (lVar5 != 0) {
    lVar5 = lVar5 >> 3;
    lVar6 = 0;
    iVar4 = 0;
    do {
      pCVar3 = ppCVar1[lVar6];
      if (pCVar3->active == true) {
        pCVar3->offset = iVar4;
        iVar4 = iVar4 + 1;
        this->n_c = iVar4;
      }
      lVar6 = lVar6 + 1;
    } while (lVar5 + (ulong)(lVar5 == 0) != lVar6);
    return iVar4;
  }
  return 0;
}

Assistant:

int ChSystemDescriptor::CountActiveConstraints() {
    if (freeze_count)  // optimization, avoid list count all times
        return n_c;

    auto vc_size = vconstraints.size();

    n_c = 0;
    for (size_t ic = 0; ic < vc_size; ic++) {
        if (vconstraints[ic]->IsActive()) {
            vconstraints[ic]->SetOffset(n_c);  // also store offsets in state and MC matrix
            n_c++;
        }
    }
    return n_c;
}